

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O3

void __thiscall Logic_AndOr_Test::TestBody(Logic_AndOr_Test *this)

{
  anon_enum_32 aVar1;
  long *plVar2;
  internal iVar3;
  AssertionResult *this_00;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  undefined1 local_178 [8];
  MockParser mock;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  
  MockParser::MockParser
            ((MockParser *)local_178,
             "let a = 3\nlet b = 4\nlet c = 5\nlet d = a == 3 && b == 4 || c == 5\nlet e = (a == 3 || b == 4) && c == 5\nlet f = a == 3 && (b == 4 || c == 5)\nlet g = a == 3 && b == 4 || c == 5 && d == 6\nlet h = (a == 3 || b == 4) && (c == 5 || d == 6)\n"
            );
  bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar5;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar5) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d6,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar1 = *(anon_enum_32 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4)
  ;
  local_30._0_4_ = aVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d6,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
  local_30._0_4_ = PRIM_NIL;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d6,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
  gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
  local_30._0_4_ = PRIM_NIL;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  iVar3 = local_50[0];
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d6,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar3 == (internal)0x0) goto LAB_0013070a;
  bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar5;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar5) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d7,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar1 = *(anon_enum_32 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4)
  ;
  local_30._0_4_ = aVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
  local_30._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
  gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
  local_30._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  iVar3 = local_50[0];
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar3 == (internal)0x0) goto LAB_0013070a;
  bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar5;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar5) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d8,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0013070a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar1 = *(anon_enum_32 *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4)
  ;
  local_30._0_4_ = aVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1d8,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
LAB_001306ef:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message((Message *)local_30);
LAB_00130701:
    this_00 = (AssertionResult *)local_50;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
    local_30._0_4_ = PRIM_FALSE;
    testing::internal::CmpHelperEQ<unsigned_char,int>
              ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,(int *)local_30)
    ;
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1d8,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
      goto LAB_001306ef;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
    gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
    local_30._0_4_ = PRIM_FALSE;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
               (int *)local_30);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1d8,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
      goto LAB_001306ef;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
    local_30[0] = bVar5;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (!bVar5) {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_30,
                 (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1da,(char *)CONCAT71(local_50._1_7_,local_50[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
      goto LAB_00130690;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
    aVar1 = *(anon_enum_32 *)
             (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
    local_30._0_4_ = aVar1 & 0xff;
    gtest_ar_.message_.ptr_._0_1_ = 0x13;
    gtest_ar_.message_.ptr_._1_1_ = 0;
    gtest_ar_.message_.ptr_._2_2_ = 0;
    mock.cur_fn = mock.cur_fn + 1;
    testing::internal::CmpHelperEQ<BcOp,BcOp>
              ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
               (BcOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1da,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
      goto LAB_001306ef;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
    local_30._0_4_ = PRIM_NIL;
    testing::internal::CmpHelperEQ<unsigned_char,int>
              ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,(int *)local_30)
    ;
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1da,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
      goto LAB_001306ef;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
    gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
    local_30._0_4_ = PRIM_NIL;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
               (int *)local_30);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x1da,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
      goto LAB_001306ef;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
    local_30[0] = bVar5;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar5) {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1db,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1db,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dc,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dd,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dd,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1dd,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1de,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1de,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1de,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1de,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1df,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1df,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1df,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e0,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","3",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_TRUE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e1,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e1,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 1;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 2 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e1,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e2,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","3",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_FALSE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e4,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e4,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e4,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e4,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e5,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e5,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e5,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e6,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e7,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e7,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 4;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 5 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e7,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e8,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e9,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e9,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1e9,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ea,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ea,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 4;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","4",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ea,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_TRUE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ea,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1eb,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1eb,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 1;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 2 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1eb,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ec,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ec,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 4;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","4",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ec,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_FALSE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ec,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ee,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ee,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ee,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ee,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ef,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ef,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 6;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 7 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ef,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f0,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f1,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f1,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f1,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f2,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,499,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,499,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,499,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,500,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,500,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 5;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","5",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,500,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_TRUE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,500,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f5,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f5,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 1;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 2 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f5,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f6,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 5;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","5",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_FALSE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f6,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f8,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f9,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f9,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1f9,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fa,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fa,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fa,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fa,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fb,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fb,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 4;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 5 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fb,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fc,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fc,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fd,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fd,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 4;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 5 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fd,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fe,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fe,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","3",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fe,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","3",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1fe,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ff,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ff,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x1ff,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x200,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x200,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 6;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","6",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x200,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_TRUE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x200,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x201,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x201,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 1;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 2 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x201,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x202,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x202,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 6;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","6",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x202,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_FALSE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x202,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x204,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x204,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x204,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x204,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x205,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x205,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x205,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x206,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x206,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x206,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x206,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x207,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x207,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 6;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 7 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x207,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x208,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x10;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_EQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x208,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x208,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x208,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x209,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x209,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x209,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20a,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x13;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20a,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","3",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20a,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","3",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20a,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20b,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20b,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20b,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20c,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20c,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 7;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","7",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20c,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_TRUE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_TRUE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20c,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20d,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x1d;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20d,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      local_30._0_4_ = aVar1 >> 8;
      gtest_ar_.message_.ptr_._0_1_ = 1;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0x80;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_50,"bc_arg24(ins)","0x800000 + 2 - 1",(uint *)local_30,
                 (int *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20d,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20e,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 2;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_SET_P",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20e,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = 7;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","7",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20e,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      gtest_ar_.message_.ptr_._1_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_FALSE;
      testing::internal::CmpHelperEQ<unsigned_short,Primitive>
                ((internal *)local_50,"bc_arg16(ins)","PRIM_FALSE",
                 (unsigned_short *)&gtest_ar_.message_,(anon_enum_32 *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x20e,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      bVar5 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
      local_30[0] = bVar5;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (!bVar5) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_30,
                   (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x210,(char *)CONCAT71(local_50._1_7_,local_50[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
        goto LAB_00130690;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      aVar1 = *(anon_enum_32 *)
               (*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
      local_30._0_4_ = aVar1 & 0xff;
      gtest_ar_.message_.ptr_._0_1_ = 0x20;
      gtest_ar_.message_.ptr_._1_1_ = 0;
      gtest_ar_.message_.ptr_._2_2_ = 0;
      mock.cur_fn = mock.cur_fn + 1;
      testing::internal::CmpHelperEQ<BcOp,BcOp>
                ((internal *)local_50,"bc_op(ins)","BC_RET",(BcOp *)local_30,
                 (BcOp *)&gtest_ar_.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x210,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 8);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x210,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x10);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg2(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x210,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(aVar1 >> 0x18);
      local_30._0_4_ = PRIM_NIL;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg3(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x210,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_001306ef;
      }
      goto LAB_00130701;
    }
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x1db,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
LAB_00130690:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    testing::Message::~Message((Message *)&gtest_ar_.message_);
    this_00 = (AssertionResult *)local_30;
  }
  testing::AssertionResult::~AssertionResult(this_00);
LAB_0013070a:
  vm_free((VM *)local_178);
  return;
}

Assistant:

TEST(Logic, AndOr) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = 5\n"
		"let d = a == 3 && b == 4 || c == 5\n"
		"let e = (a == 3 || b == 4) && c == 5\n"
		"let f = a == 3 && (b == 4 || c == 5)\n"
		"let g = a == 3 && b == 4 || c == 5 && d == 6\n"
		"let h = (a == 3 || b == 4) && (c == 5 || d == 6)\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_N, 2, 2);

	INS2(BC_NEQ_LN, 0, 0);
	JMP(3);
	INS2(BC_EQ_LN, 1, 1);
	JMP(3);
	INS2(BC_NEQ_LN, 2, 2);
	JMP(3);
	INS2(BC_SET_P, 3, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 3, PRIM_FALSE);

	INS2(BC_EQ_LN, 0, 0);
	JMP(3);
	INS2(BC_NEQ_LN, 1, 1);
	JMP(5);
	INS2(BC_NEQ_LN, 2, 2);
	JMP(3);
	INS2(BC_SET_P, 4, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 4, PRIM_FALSE);

	INS2(BC_NEQ_LN, 0, 0);
	JMP(7);
	INS2(BC_EQ_LN, 1, 1);
	JMP(3);
	INS2(BC_NEQ_LN, 2, 2);
	JMP(3);
	INS2(BC_SET_P, 5, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 5, PRIM_FALSE);

	INS2(BC_NEQ_LN, 0, 0);
	JMP(3);
	INS2(BC_EQ_LN, 1, 1);
	JMP(5);
	INS2(BC_NEQ_LN, 2, 2);
	JMP(5);
	INS2(BC_NEQ_LN, 3, 3);
	JMP(3);
	INS2(BC_SET_P, 6, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 6, PRIM_FALSE);

	INS2(BC_EQ_LN, 0, 0);
	JMP(3);
	INS2(BC_NEQ_LN, 1, 1);
	JMP(7);
	INS2(BC_EQ_LN, 2, 2);
	JMP(3);
	INS2(BC_NEQ_LN, 3, 3);
	JMP(3);
	INS2(BC_SET_P, 7, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 7, PRIM_FALSE);

	INS(BC_RET, 0, 0, 0);
}